

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3Lesser_Test::TestBody(VectorsTest_FP3Lesser_Test *this)

{
  bool bVar1;
  char *pcVar2;
  String *this_00;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FP3 v3;
  FP3 v2;
  FP3 v1;
  undefined1 in_stack_fffffffffffffdcf;
  String *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined1 uVar3;
  undefined8 in_stack_fffffffffffffde8;
  int line;
  char *in_stack_fffffffffffffdf0;
  AssertionResult *this_01;
  Type in_stack_fffffffffffffdfc;
  Type type;
  AssertHelper *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined1 uVar4;
  AssertHelper *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar5;
  AssertionResult *in_stack_fffffffffffffe48;
  String local_188 [2];
  AssertionResult local_168;
  String local_158 [2];
  AssertionResult local_138;
  String local_128 [2];
  AssertionResult local_108;
  String local_f8 [2];
  AssertionResult local_d8;
  String local_c8 [2];
  AssertionResult local_a8;
  uint local_94;
  String local_90 [3];
  AssertionResult local_60;
  Vector3<double> local_50;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  line = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  pica::Vector3<double>::Vector3(&local_20,13.0,25.0,21.0);
  pica::Vector3<double>::Vector3(&local_38,6.0,8.0,2.0);
  pica::Vector3<double>::Vector3(&local_50,14.0,6.0,1.0);
  pica::operator<(&local_20,&local_38);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffe48,
               (char *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe48 = (AssertionResult *)testing::internal::String::c_str(local_90);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,line,
               (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,
               (Message *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
    testing::internal::String::~String(in_stack_fffffffffffffdd0);
    testing::Message::~Message((Message *)0x1e6840);
  }
  local_94 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e68ce);
  if (local_94 == 0) {
    pica::operator<(&local_38,&local_20);
    this_02 = &local_a8;
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_fffffffffffffe48,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe40),
                 &this_02->success_,(char *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe30 = (AssertHelper *)testing::internal::String::c_str(local_c8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,line,
                 (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe30,
                 (Message *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::internal::String::~String(in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x1e6a06);
    }
    local_94 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6a94);
    if (local_94 == 0) {
      pica::operator<(&local_20,&local_50);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe00);
        testing::internal::GetBoolAssertionFailureMessage
                  (in_stack_fffffffffffffe48,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe40),
                   &this_02->success_,(char *)in_stack_fffffffffffffe30);
        testing::internal::String::c_str(local_f8);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                   line,(char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar4,in_stack_fffffffffffffe28));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
        testing::internal::String::~String(in_stack_fffffffffffffdd0);
        testing::Message::~Message((Message *)0x1e6bce);
      }
      local_94 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6c5c);
      if (local_94 == 0) {
        pica::operator<(&local_50,&local_20);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          testing::internal::GetBoolAssertionFailureMessage
                    (in_stack_fffffffffffffe48,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe40),
                     &this_02->success_,(char *)in_stack_fffffffffffffe30);
          in_stack_fffffffffffffe00 = (AssertHelper *)testing::internal::String::c_str(local_128);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                     line,(char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar4,in_stack_fffffffffffffe28))
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::internal::String::~String(in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x1e6d96);
        }
        local_94 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6e24);
        if (local_94 == 0) {
          pica::operator<(&local_38,&local_50);
          this_01 = &local_138;
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
          type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdfc);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            testing::internal::GetBoolAssertionFailureMessage
                      (in_stack_fffffffffffffe48,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe40),
                       &this_02->success_,(char *)in_stack_fffffffffffffe30);
            pcVar2 = testing::internal::String::c_str(local_158);
            line = (int)((ulong)pcVar2 >> 0x20);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe00,type,&this_01->success_,line,
                       (char *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe30,
                       (Message *)CONCAT17(uVar4,in_stack_fffffffffffffe28));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdd0);
            testing::internal::String::~String(in_stack_fffffffffffffdd0);
            testing::Message::~Message((Message *)0x1e6f5e);
          }
          local_94 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6fec);
          if (local_94 == 0) {
            pica::operator<(&local_50,&local_38);
            testing::AssertionResult::AssertionResult
                      ((AssertionResult *)in_stack_fffffffffffffdd0,(bool)in_stack_fffffffffffffdcf)
            ;
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
            if (!bVar1) {
              uVar3 = bVar1;
              testing::Message::Message((Message *)in_stack_fffffffffffffe00);
              testing::internal::GetBoolAssertionFailureMessage
                        (in_stack_fffffffffffffe48,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe40)
                         ,&this_02->success_,(char *)in_stack_fffffffffffffe30);
              this_00 = (String *)testing::internal::String::c_str(local_188);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffe00,type,&this_01->success_,line,
                         (char *)CONCAT17(uVar3,in_stack_fffffffffffffde0));
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe30,
                         (Message *)CONCAT17(uVar4,in_stack_fffffffffffffe28));
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
              testing::internal::String::~String(this_00);
              testing::Message::~Message((Message *)0x1e7126);
            }
            local_94 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e71b4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3Lesser)
{
    FP3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 6, 1);
    ASSERT_FALSE(v1 < v2);
    ASSERT_TRUE(v2 < v1);
    ASSERT_FALSE(v1 < v3);
    ASSERT_FALSE(v3 < v1);
    ASSERT_FALSE(v2 < v3);
    ASSERT_FALSE(v3 < v2);
}